

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::computeDualInfeasInDual(HModel *this,int *dualInfeasCount)

{
  double dVar1;
  double dVar2;
  pointer pdVar3;
  long lVar4;
  int iVar5;
  
  if ((long)this->numTot < 1) {
    iVar5 = 0;
  }
  else {
    pdVar3 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    iVar5 = 0;
    do {
      if ((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar4] != 0) {
        dVar1 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4];
        dVar2 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4];
        if ((dVar1 != -1e+200) || (NAN(dVar1))) {
          if ((dVar2 != 1e+200) || (NAN(dVar2))) goto LAB_0012de0e;
        }
        else if ((dVar2 == 1e+200) && (!NAN(dVar2))) {
          iVar5 = (iVar5 + 1) - (uint)(ABS(pdVar3[lVar4]) < this->dblOption[2]);
        }
        iVar5 = (iVar5 + 1) -
                (uint)(-this->dblOption[2] <
                      (double)(this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar4] * pdVar3[lVar4]);
      }
LAB_0012de0e:
      lVar4 = lVar4 + 1;
    } while (this->numTot != lVar4);
  }
  *dualInfeasCount = iVar5;
  return;
}

Assistant:

void HModel::computeDualInfeasInDual(int *dualInfeasCount) {
    int workCount = 0;
    const double inf = HSOL_CONST_INF;
    const double tau_d = dblOption[DBLOPT_DUAL_TOL];
    for (int i = 0; i < numTot; i++) {
        // Only for non basic variables
        if (!nonbasicFlag[i])
            continue;
        // Free
        if (workLower[i] == -inf && workUpper[i] == inf)
            workCount += (fabs(workDual[i]) >= tau_d);
        // In dual, assuming that boxed variables will be flipped
        if (workLower[i] == -inf || workUpper[i] == inf)
            workCount += (nonbasicMove[i] * workDual[i] <= -tau_d);
    }
    *dualInfeasCount = workCount;
}